

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O3

bool __thiscall Map::testConnected(Map *this)

{
  pointer ppCVar1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *toTest;
  bool bVar2;
  bool bVar3;
  pointer ppCVar4;
  
  bVar3 = false;
  bVar2 = testIndividualGraph(this->pMapCountries,false);
  if (bVar2) {
    ppCVar1 = (this->pMapContinents->
              super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    bVar3 = true;
    for (ppCVar4 = (this->pMapContinents->
                   super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
      toTest = (*ppCVar4)->pCountriesInContinent;
      if (((long)(toTest->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(toTest->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                 _M_impl.super__Vector_impl_data._M_start != 8) &&
         (bVar2 = testIndividualGraph(toTest,true), !bVar2)) {
        return false;
      }
    }
  }
  return bVar3;
}

Assistant:

bool Map::testConnected() {
    //test overall graph
    if(testIndividualGraph(this->pMapCountries,false)){
        //test subgraphs
        for(auto continent : *this->pMapContinents){
            if(continent->getCountriesInContinent()->size() == 1){
                continue;
            }else if(!testIndividualGraph(continent->getCountriesInContinent(),true)){
                return false;
            }
        }
        return true;
    }
    return false;
}